

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O3

UINT8 es5503_r(void *info,UINT8 offset)

{
  byte bVar1;
  UINT8 UVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  
  if (offset < 0xe0) {
    uVar5 = (ulong)(offset & 0x1f);
    switch(offset) {
    default:
      return *(UINT8 *)((long)info + uVar5 * 0x18 + 0x38);
    case ' ':
    case '!':
    case '\"':
    case '#':
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
    case '-':
    case '.':
    case '/':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case ':':
    case ';':
    case '<':
    case '=':
    case '>':
    case '?':
      return *(UINT8 *)((long)info + uVar5 * 0x18 + 0x39);
    case '@':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
    case 'N':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'U':
    case 'V':
    case 'W':
    case 'X':
    case 'Y':
    case 'Z':
    case '[':
    case '\\':
    case ']':
    case '^':
    case '_':
      return *(UINT8 *)((long)info + uVar5 * 0x18 + 0x3d);
    case '`':
    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
    case 's':
    case 't':
    case 'u':
    case 'v':
    case 'w':
    case 'x':
    case 'y':
    case 'z':
    case '{':
    case '|':
    case '}':
    case '~':
    case '\x7f':
      return *(UINT8 *)((long)info + uVar5 * 0x18 + 0x3e);
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
    case 0x90:
    case 0x91:
    case 0x92:
    case 0x93:
    case 0x94:
    case 0x95:
    case 0x96:
    case 0x97:
    case 0x98:
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
      return *(UINT8 *)((long)info + uVar5 * 0x18 + 0x41);
    case 0xa0:
    case 0xa1:
    case 0xa2:
    case 0xa3:
    case 0xa4:
    case 0xa5:
    case 0xa6:
    case 0xa7:
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf:
    case 0xb0:
    case 0xb1:
    case 0xb2:
    case 0xb3:
    case 0xb4:
    case 0xb5:
    case 0xb6:
    case 0xb7:
    case 0xb8:
    case 0xb9:
    case 0xba:
    case 0xbb:
    case 0xbc:
    case 0xbd:
    case 0xbe:
    case 0xbf:
      return *(UINT8 *)((long)info + uVar5 * 0x18 + 0x3c);
    case 0xc0:
    case 0xc1:
    case 0xc2:
    case 0xc3:
    case 0xc4:
    case 0xc5:
    case 0xc6:
    case 199:
    case 200:
    case 0xc9:
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xcf:
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
    case 0xd8:
    case 0xd9:
    case 0xda:
    case 0xdb:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
      return *(char *)((long)info + uVar5 * 0x18 + 0x44) << 3 |
             *(byte *)((long)info + uVar5 * 0x18 + 0x45) |
             (byte)(*(uint *)((long)info + uVar5 * 0x18 + 0x40) >> 10) & 0x40;
    }
  }
  if (offset == 0xe2) {
    if (*(code **)((long)info + 0x28) != (code *)0x0) {
      UVar2 = (**(code **)((long)info + 0x28))(*(undefined8 *)((long)info + 0x30),0);
      return UVar2;
    }
  }
  else {
    if (offset == 0xe1) {
      return *(char *)((long)info + 0x338) * '\x02' + 0xfe;
    }
    if (offset == 0xe0) {
      bVar6 = *(byte *)((long)info + 0x339);
      if (*(code **)((long)info + 0x18) != (code *)0x0) {
        (**(code **)((long)info + 0x18))(*(undefined8 *)((long)info + 0x20),0);
      }
      bVar1 = *(byte *)((long)info + 0x338);
      if (bVar1 == 0) {
        return bVar6;
      }
      pcVar3 = (char *)((long)info + 0x4c);
      uVar5 = 0;
      do {
        if (*pcVar3 != '\0') {
          bVar6 = (byte)uVar5;
          *(byte *)((long)info + 0x339) = bVar6 | 0x80;
          *pcVar3 = '\0';
          break;
        }
        uVar5 = uVar5 + 2;
        pcVar3 = pcVar3 + 0x18;
      } while ((uint)bVar1 + (uint)bVar1 != uVar5);
      if (bVar1 == 0) {
        return bVar6;
      }
      lVar4 = 0;
      do {
        if (*(char *)((long)info + lVar4 + 0x4c) != '\0') {
          if (*(code **)((long)info + 0x18) == (code *)0x0) {
            return bVar6;
          }
          (**(code **)((long)info + 0x18))(*(undefined8 *)((long)info + 0x20),1);
          return bVar6;
        }
        lVar4 = lVar4 + 0x18;
      } while ((ulong)bVar1 * 0x18 != lVar4);
      return bVar6;
    }
  }
  return '\0';
}

Assistant:

static UINT8 es5503_r(void *info, UINT8 offset)
{
	UINT8 retval;
	int i;
	ES5503Chip *chip = (ES5503Chip *)info;

	if (offset < 0xe0)
	{
		UINT8 osc = offset & 0x1f;

		switch(offset & 0xe0)
		{
			case 0:     // freq lo
				return (chip->oscillators[osc].freq & 0xff);

			case 0x20:      // freq hi
				return (chip->oscillators[osc].freq >> 8);

			case 0x40:  // volume
				return chip->oscillators[osc].vol;

			case 0x60:  // data
				return chip->oscillators[osc].data;

			case 0x80:  // wavetable pointer
				return (chip->oscillators[osc].wavetblpointer>>8) & 0xff;

			case 0xa0:  // oscillator control
				return chip->oscillators[osc].control;

			case 0xc0:  // bank select / wavetable size / resolution
				retval = 0;
				if (chip->oscillators[osc].wavetblpointer & 0x10000)
				{
					retval |= 0x40;
				}

				retval |= (chip->oscillators[osc].wavetblsize<<3);
				retval |= chip->oscillators[osc].resolution;
				return retval;
		}
	}
	else     // global registers
	{
		switch (offset)
		{
			case 0xe0:  // interrupt status
				retval = chip->rege0;

				if (chip->irq_func != NULL)
					chip->irq_func(chip->irq_param, 0);

				// scan all oscillators
				for (i = 0; i < chip->oscsenabled; i++)
				{
					if (chip->oscillators[i].irqpend)
					{
						// signal this oscillator has an interrupt
						retval = i<<1;

						chip->rege0 = retval | 0x80;

						// and clear its flag
						chip->oscillators[i].irqpend = 0;
						break;
					}
				}

				// if any oscillators still need to be serviced, assert IRQ again immediately
				for (i = 0; i < chip->oscsenabled; i++)
				{
					if (chip->oscillators[i].irqpend)
					{
						if (chip->irq_func != NULL)
							chip->irq_func(chip->irq_param, 1);
						break;
					}
				}

				return retval;

			case 0xe1:  // oscillator enable
				return (chip->oscsenabled-1)<<1;

			case 0xe2:  // A/D converter
				if (chip->adc_func != NULL)
					return chip->adc_func(chip->adc_param, 0);
				break;
		}
	}

	return 0;
}